

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O3

uint16_t NJamSpell::PackInt32(uint32_t num)

{
  double dVar1;
  
  if ((double)num * 3.725290298461914e-09 <= 1.0) {
    dVar1 = pow((double)num * 3.725290298461914e-09,0.2);
    return (uint16_t)(int)(dVar1 * 65536.0);
  }
  __assert_fail("r >= 0.0 && r <= 1.0",
                "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/jamspell/lang_model.cpp"
                ,0x45,"uint16_t NJamSpell::PackInt32(uint32_t)");
}

Assistant:

uint16_t PackInt32(uint32_t num) {
    double r = double(num) / double(MAX_REAL_NUM);
    assert(r >= 0.0 && r <= 1.0);
    r = pow(r, 0.2);
    r *= MAX_AVAILABLE_NUM;
    return uint16_t(r);
}